

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O2

void __thiscall naiveproxy::~naiveproxy(naiveproxy *this)

{
  void *pvVar1;
  list<naiveconfig_*,_std::allocator<naiveconfig_*>_> *this_00;
  _List_node_base *p_Var2;
  
  if (this->oncefd != -1) {
    close(this->oncefd);
  }
  this_00 = &this->cfgs;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)this_00) {
    pvVar1 = p_Var2[1]._M_next;
    if (pvVar1 != (void *)0x0) {
      std::__cxx11::string::~string((string *)((long)pvVar1 + 0x18));
    }
    operator_delete(pvVar1);
  }
  std::__cxx11::_List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_>::_M_clear
            (&this_00->super__List_base<naiveconfig_*,_std::allocator<naiveconfig_*>_>);
  return;
}

Assistant:

naiveproxy::~naiveproxy()
{
    //printf("destructor\n");
    //关闭打开文件
    if (oncefd != -1)
        close(oncefd);

    for (auto it = cfgs.begin(); it != cfgs.end(); it++)
    {
        delete *it;
    }
}